

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

unsigned_short
capnp::(anonymous_namespace)::checkRoundTrip<unsigned_short,unsigned_long>(unsigned_long value)

{
  ulong in_RDI;
  undefined1 local_10 [8];
  
  if (0xffff < in_RDI) {
    checkRoundTrip<unsigned_short,unsigned_long>(local_10);
  }
  return (unsigned_short)in_RDI;
}

Assistant:

T checkRoundTrip(U value) {
#if __aarch64__
  // Work around an apparently broken compiler optimization on Clang / arm64. It appears that
  // for T = int8_t, U = double, and value = 128, the compiler incorrectly believes that the
  // round-trip does not change the value, where in fact it should change to -128. Similar problems
  // exist for various other types and inputs -- json-test seems to exercise several problem cases.
  // The problem only exists when compiling with optimization. In any case, declaring the variable
  // `volatile` kills the optimization.
  volatile
#endif
  T result = value;
  KJ_REQUIRE(U(result) == value, "Value out-of-range for requested type.", value) {
    // Use it anyway.
    break;
  }
  return result;
}